

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

size_t __thiscall llama_context::state_seq_get_size(llama_context *this,llama_seq_id seq_id)

{
  int iVar1;
  undefined4 extraout_var;
  llama_io_write_dummy io;
  llama_io_write_i local_18;
  undefined8 local_10;
  
  local_18._vptr_llama_io_write_i = (_func_int **)&PTR__llama_io_write_i_00286440;
  local_10 = 0;
  llama_kv_cache_unified::state_write
            ((this->kv_self)._M_t.
             super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
             ._M_t.
             super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
             .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,&local_18,seq_id);
  iVar1 = (*local_18._vptr_llama_io_write_i[4])();
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t llama_context::state_seq_get_size(llama_seq_id seq_id) {
    llama_io_write_dummy io;
    try {
        return state_seq_write_data(io, seq_id);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error getting state size: %s\n", __func__, err.what());
        return 0;
    }
}